

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O2

void presolve::dev_kkt_check::checkBasicFeasibleSolution(State *state,KktConditionDetails *details)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int j;
  long lVar8;
  bool bVar9;
  double dVar10;
  
  for (lVar8 = 0; lVar8 < state->numCol; lVar8 = lVar8 + 1) {
    if ((((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar8] != 0) &&
        (details->checked = details->checked + 1,
        (state->col_status->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)
        ._M_impl.super__Vector_impl_data._M_start[lVar8] == kBasic)) &&
       (1e-07 < ABS((state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar8]))) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Col ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar8);
      std::operator<<(poVar3," is basic but has nonzero dual ");
      poVar3 = std::ostream::_M_insert<double>
                         ((state->colDual->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_start[lVar8]);
      poVar3 = std::operator<<(poVar3,".");
      std::endl<char,std::char_traits<char>>(poVar3);
      dVar1 = (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (dVar1 != 0.0) {
        details->violated = details->violated + 1;
        dVar10 = ABS(dVar1);
        details->sum_violation_2 = dVar1 * dVar1 + details->sum_violation_2;
        if (details->max_violation <= dVar10 && dVar10 != details->max_violation) {
          details->max_violation = dVar10;
        }
      }
    }
  }
  for (lVar8 = 0; lVar8 < state->numRow; lVar8 = lVar8 + 1) {
    if ((((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar8] != 0) &&
        (details->checked = details->checked + 1,
        (state->row_status->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)
        ._M_impl.super__Vector_impl_data._M_start[lVar8] == kBasic)) &&
       (1e-07 < ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar8]))) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Row ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar8);
      std::operator<<(poVar3," is basic but has nonzero dual: ");
      poVar3 = std::ostream::_M_insert<double>
                         (ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start[lVar8]));
      std::endl<char,std::char_traits<char>>(poVar3);
      dVar1 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (dVar1 != 0.0) {
        details->violated = details->violated + 1;
        dVar10 = ABS(dVar1);
        details->sum_violation_2 = dVar1 * dVar1 + details->sum_violation_2;
        if (details->max_violation <= dVar10 && dVar10 != details->max_violation) {
          details->max_violation = dVar10;
        }
      }
    }
  }
  if (details->violated == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"BFS.");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"BFS X Violated: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,details->violated);
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar6 = 0;
  uVar4 = (ulong)(uint)state->numRow;
  if (state->numRow < 1) {
    uVar4 = uVar6;
  }
  iVar5 = 0;
  iVar2 = 0;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    bVar9 = (state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar6] != 0;
    if (bVar9) {
      iVar2 = iVar2 + (uint)((state->row_status->
                             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar6] == kBasic);
    }
    iVar5 = iVar5 + (uint)bVar9;
  }
  uVar6 = 0;
  uVar4 = (ulong)(uint)state->numCol;
  if (state->numCol < 1) {
    uVar4 = uVar6;
  }
  iVar7 = 0;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar6] != 0) {
      iVar7 = iVar7 + (uint)((state->col_status->
                             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar6] == kBasic);
    }
  }
  if (iVar7 + iVar2 == iVar5) {
    return;
  }
  details->violated = -1;
  poVar3 = std::operator<<((ostream *)&std::cout,"BFS X Violated WRONG basis count: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar7 + iVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void checkBasicFeasibleSolution(const State& state,
                                KktConditionDetails& details) {
  // Go over cols and check that the duals of basic values are zero.
  assert((int)state.col_status.size() == state.numCol);
  assert((int)state.colDual.size() == state.numCol);
  for (int j = 0; j < state.numCol; j++) {
    if (state.flagCol[j]) {
      details.checked++;
      double infeas = 0;
      if (state.col_status[j] == HighsBasisStatus::kBasic &&
          fabs(state.colDual[j]) > tol) {
        if (dev_print == 1)
          std::cout << "Col " << j << " is basic but has nonzero dual "
                    << state.colDual[j] << "." << std::endl;
        infeas = fabs(state.colDual[j]);
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  // Go over rows and check that the duals of basic values are zero.
  assert((int)state.row_status.size() == state.numRow);
  assert((int)state.rowDual.size() == state.numRow);
  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;
      double infeas = 0;
      if (state.row_status[i] == HighsBasisStatus::kBasic &&
          fabs(state.rowDual[i]) > tol) {
        if (dev_print == 1)
          std::cout << "Row " << i << " is basic but has nonzero dual: "
                    << fabs(state.rowDual[i]) << std::endl;
        infeas = fabs(state.rowDual[i]);
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "BFS." << std::endl;
  } else {
    if (dev_print == 1)
      std::cout << "BFS X Violated: " << details.violated << std::endl;
  }

  // check number of basic rows during postsolve.
  int current_n_rows = 0;
  int current_n_rows_basic = 0;
  int current_n_cols_basic = 0;

  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) current_n_rows++;

    if (state.flagRow[i] && state.row_status[i] == HighsBasisStatus::kBasic)
      current_n_rows_basic++;
  }

  for (int i = 0; i < state.numCol; i++) {
    if (state.flagCol[i] && state.col_status[i] == HighsBasisStatus::kBasic)
      current_n_cols_basic++;
  }

  bool holds = current_n_cols_basic + current_n_rows_basic == current_n_rows;
  if (!holds) {
    details.violated = -1;
    std::cout << "BFS X Violated WRONG basis count: "
              << current_n_cols_basic + current_n_rows_basic << " "
              << current_n_rows << std::endl;
  }
  //  assert(current_n_cols_basic + current_n_rows_basic == current_n_rows);
}